

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::ClearEntryPoints(FunctionBody *this)

{
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar1;
  Type pcVar2;
  EntryPointInfo *this_00;
  uint32 uVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  pSVar1 = (this->entryPoints).ptr;
  if (pSVar1 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                 *)0x0) {
    if (0 < (pSVar1->
            super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ).
            super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
            .count) {
      lVar7 = 0;
      do {
        pcVar2 = (((pSVar1->
                   super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ).
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                   .buffer.ptr[lVar7].ptr)->super_RecyclerWeakReferenceBase).strongRef;
        if (pcVar2 != (Type)0x0) {
          (*(code *)**(undefined8 **)pcVar2)(pcVar2,0);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (pSVar1->
                       super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       ).
                       super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                       .count);
    }
    pvVar4 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,LoopHeaderArray);
    if (pvVar4 != (void *)0x0) {
      uVar3 = GetCountField(this,LoopCount);
      if (uVar3 != 0) {
        uVar6 = 0;
        do {
          lVar7 = *(long *)((long)pvVar4 + uVar6 * 0x30);
          if ((lVar7 != 0) && (0 < *(int *)(lVar7 + 0x10))) {
            lVar5 = 0;
            do {
              this_00 = *(EntryPointInfo **)(*(long *)(lVar7 + 8) + lVar5 * 8);
              if (this_00 != (EntryPointInfo *)0x0) {
                EntryPointInfo::Cleanup(this_00,false,true);
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 < *(int *)(lVar7 + 0x10));
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar3);
      }
    }
  }
  pSVar1 = (this->entryPoints).ptr;
  lVar7 = (long)(pSVar1->
                super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ).
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                .count;
  if (lVar7 != 0) {
    memset((pSVar1->
           super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ).
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
           .buffer.ptr,0,lVar7 << 3);
    (pSVar1->
    super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ).
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
    .count = 0;
  }
  return;
}

Assistant:

void FunctionBody::ClearEntryPoints()
    {
        if (this->entryPoints)
        {
            this->MapEntryPoints([] (int index, FunctionEntryPointInfo* entryPoint)
            {
                if (nullptr != entryPoint)
                {
                    // Finalize = Free up work item if it hasn't been released yet + entry point clean up
                    // isShutdown is false because cleanup is called only in the !isShutdown case
                    entryPoint->Finalize(/*isShutdown*/ false);
                }
            });

            this->MapLoopHeaders([] (uint loopNumber, LoopHeader* header)
            {
                header->MapEntryPoints([] (int index, LoopEntryPointInfo* entryPoint)
                {
                    entryPoint->Cleanup(/*isShutdown*/ false, true /* capture cleanup stack */);
                });
            });
        }

        this->entryPoints->ClearAndZero();
    }